

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<VarCounter>_>::
ReadUInt(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<VarCounter>_>
         *this,uint ub)

{
  int value;
  uint local_14;
  
  local_14 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (ub <= local_14) {
    TextReader<fmt::Locale>::ReportError<int>(this->reader_,(CStringRef)0x21c08e,(int *)&local_14);
  }
  return local_14;
}

Assistant:

int ReadUInt(unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }